

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O1

char * cards_print(Card **cards,uchar cardsCount,_Bool showDownCards)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  
  if (cardsPrintBufIndex == 0xff) {
    cardsPrintBufIndex = '\0';
  }
  lVar4 = (ulong)cardsPrintBufIndex * 0x100 - (ulong)cardsPrintBufIndex;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xbf) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 199) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xcf) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xd7) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xdf) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xe7) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xef) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xf7) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x80) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x88) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x90) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x98) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xa0) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xa8) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xb0) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0xb8) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x40) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x48) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x50) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x58) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x60) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x68) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x70) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x78) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 8) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x10) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x18) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x20) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x28) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x30) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar4 + 0x38) = 0;
  if (cardsCount != '\0') {
    uVar5 = 0;
    do {
      if (uVar5 != 0) {
        pcVar6 = (char *)((long)cardsPrintBufs +
                         ((ulong)cardsPrintBufIndex * 0x100 - (ulong)cardsPrintBufIndex));
        sVar2 = strlen(pcVar6);
        pcVar6 = pcVar6 + sVar2;
        pcVar6[0] = ' ';
        pcVar6[1] = '\0';
      }
      uVar3 = (ulong)cardsPrintBufIndex;
      uVar1 = (ulong)cardsPrintBufIndex;
      pcVar6 = card_print(cards[uVar5],showDownCards);
      strcat((char *)((long)cardsPrintBufs + (uVar1 * 0x100 - uVar3)),pcVar6);
      uVar5 = uVar5 + 1;
    } while (cardsCount != uVar5);
  }
  cardsPrintBufIndex = cardsPrintBufIndex + 1;
  return (char *)((long)cardPrintBufs +
                 ((ulong)cardsPrintBufIndex * 0x100 - (ulong)cardsPrintBufIndex) + 0x401);
}

Assistant:

char * cards_print(Card ** cards, unsigned char cardsCount, bool showDownCards)
{
	unsigned char i;
	if(cardsPrintBufIndex>=255)
		cardsPrintBufIndex = 0;

	memset(cardsPrintBufs[cardsPrintBufIndex], 0, 255);

	for(i=0;i<cardsCount;i++)
	{
		if(i>0)
			strcat(cardsPrintBufs[cardsPrintBufIndex], " ");

		strcat(cardsPrintBufs[cardsPrintBufIndex], card_print(cards[i], showDownCards));
	}

	cardsPrintBufIndex++;
	return cardsPrintBufs[(cardsPrintBufIndex-1)];
}